

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

double av1_get_compression_ratio(AV1_COMMON *cm,size_t encoded_frame_size)

{
  char cVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  cVar1 = cm->seq_params->profile;
  lVar3 = 0x24;
  if (cVar1 == '\x01') {
    lVar3 = 0x1e;
  }
  lVar2 = 0xf;
  if (cVar1 != '\0') {
    lVar2 = lVar3;
  }
  lVar3 = 1;
  if (0x81 < encoded_frame_size) {
    lVar3 = encoded_frame_size - 0x80;
  }
  auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar4._0_8_ = lVar3;
  auVar4._12_4_ = 0x45300000;
  return (double)((long)cm->height * (long)cm->superres_upscaled_width * lVar2 >> 3) /
         ((auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0));
}

Assistant:

double av1_get_compression_ratio(const AV1_COMMON *const cm,
                                 size_t encoded_frame_size) {
  const int upscaled_width = cm->superres_upscaled_width;
  const int height = cm->height;
  const int64_t luma_pic_size = (int64_t)upscaled_width * height;
  const SequenceHeader *const seq_params = cm->seq_params;
  const BITSTREAM_PROFILE profile = seq_params->profile;
  const int pic_size_profile_factor =
      profile == PROFILE_0 ? 15 : (profile == PROFILE_1 ? 30 : 36);
  encoded_frame_size =
      (encoded_frame_size > 129 ? encoded_frame_size - 128 : 1);
  const int64_t uncompressed_frame_size =
      (luma_pic_size * pic_size_profile_factor) >> 3;
  return (double)uncompressed_frame_size / encoded_frame_size;
}